

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::setDrawBuffers(GLFrameBuffer *this)

{
  GLsizei GVar1;
  int iVar2;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffs;
  
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])();
  buffs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar2 = 0; GVar1 = (this->super_FrameBuffer).nColorBuffers, iVar2 < GVar1; iVar2 = iVar2 + 1)
  {
    local_3c = iVar2 + 0x8ce0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&buffs,&local_3c);
  }
  if (0 < GVar1) {
    (*glad_glDrawBuffers)
              (GVar1,buffs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  checkGLError(true);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&buffs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void GLFrameBuffer::setDrawBuffers() {
  bind();

  std::vector<GLenum> buffs;
  for (int i = 0; i < nColorBuffers; i++) {
    buffs.push_back(GL_COLOR_ATTACHMENT0 + i);
  }
  if (nColorBuffers > 0) {
    glDrawBuffers(nColorBuffers, &buffs.front());
  }
  checkGLError();
}